

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

void tidyRelease(TidyDoc tdoc)

{
  if (tdoc == (TidyDoc)0x0) {
    return;
  }
  if (*(long *)(tdoc + 0xcf8) == 0) {
    if (*(long *)(tdoc + 0xcfa) == 0) {
      prvTidyReleaseStreamOut((TidyDocImpl *)tdoc,*(StreamOut **)(tdoc + 0xcfc));
      *(undefined8 *)(tdoc + 0xcfc) = 0;
      prvTidyFreePrintBuf((TidyDocImpl *)tdoc);
      prvTidyFreeNode((TidyDocImpl *)tdoc,(Node *)tdoc);
      *(undefined8 *)(tdoc + 0x18) = 0;
      *(undefined8 *)(tdoc + 0x1a) = 0;
      *(undefined8 *)(tdoc + 0x14) = 0;
      *(undefined8 *)(tdoc + 0x16) = 0;
      *(undefined8 *)(tdoc + 0x10) = 0;
      *(undefined8 *)(tdoc + 0x12) = 0;
      *(undefined8 *)(tdoc + 0xc) = 0;
      *(undefined8 *)(tdoc + 0xe) = 0;
      *(undefined8 *)(tdoc + 8) = 0;
      *(undefined8 *)(tdoc + 10) = 0;
      *(undefined8 *)(tdoc + 4) = 0;
      *(undefined8 *)(tdoc + 6) = 0;
      *(undefined8 *)tdoc = 0;
      *(undefined8 *)(tdoc + 2) = 0;
      if (*(long *)(tdoc + 0xd2a) != 0) {
        (**(code **)(**(long **)(tdoc + 0xd20) + 0x10))();
      }
      prvTidyFreeConfig((TidyDocImpl *)tdoc);
      prvTidyFreeAttrTable((TidyDocImpl *)tdoc);
      prvTidyFreeAttrPriorityList((TidyDocImpl *)tdoc);
      prvTidyFreeMutedMessageList((TidyDocImpl *)tdoc);
      prvTidyFreeTags((TidyDocImpl *)tdoc);
      prvTidyFreeLexer((TidyDocImpl *)tdoc);
      prvTidyFreeParserStack((TidyDocImpl *)tdoc);
      (**(code **)(**(long **)(tdoc + 0xd20) + 0x10))(*(long **)(tdoc + 0xd20),tdoc);
      return;
    }
    __assert_fail("doc->docOut == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/tidylib.c"
                  ,0x9a,"void tidyDocRelease(TidyDocImpl *)");
  }
  __assert_fail("doc->docIn == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/tidylib.c"
                ,0x99,"void tidyDocRelease(TidyDocImpl *)");
}

Assistant:

void          tidyDocRelease( TidyDocImpl* doc )
{
    /* doc in/out opened and closed by parse/print routines */
    if ( doc )
    {
        assert( doc->docIn == NULL );
        assert( doc->docOut == NULL );

        TY_(ReleaseStreamOut)( doc, doc->errout );
        doc->errout = NULL;

        TY_(FreePrintBuf)( doc );
        TY_(FreeNode)(doc, &doc->root);
        TidyClearMemory(&doc->root, sizeof(Node));

        if (doc->givenDoctype)
            TidyDocFree(doc, doc->givenDoctype);

        TY_(FreeConfig)( doc );
        TY_(FreeAttrTable)( doc );
        TY_(FreeAttrPriorityList)( doc );
        TY_(FreeMutedMessageList( doc ));
        TY_(FreeTags)( doc );
        /*\ 
         *  Issue #186 - Now FreeNode depend on the doctype, so the lexer is needed
         *  to determine which hash is to be used, so free it last.
        \*/
        TY_(FreeLexer)( doc );
        TY_(FreeParserStack)( doc );
        TidyDocFree( doc, doc );
    }
}